

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_tls_write_group(mbedtls_ecp_group *grp,size_t *olen,uchar *buf,size_t blen)

{
  int iVar1;
  mbedtls_ecp_curve_info *pmVar2;
  mbedtls_ecp_group_id mVar3;
  
  pmVar2 = ecp_supported_curves;
  mVar3 = MBEDTLS_ECP_DP_SECP521R1;
  do {
    if (mVar3 == grp->id) goto LAB_0017069a;
    mVar3 = pmVar2[1].grp_id;
    pmVar2 = pmVar2 + 1;
  } while (mVar3 != MBEDTLS_ECP_DP_NONE);
  pmVar2 = (mbedtls_ecp_curve_info *)0x0;
LAB_0017069a:
  if (pmVar2 != (mbedtls_ecp_curve_info *)0x0) {
    *olen = 3;
    iVar1 = -0x4f00;
    if (2 < blen) {
      *buf = '\x03';
      buf[1] = *(uchar *)((long)&pmVar2->tls_id + 1);
      buf[2] = (uchar)pmVar2->tls_id;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_tls_write_group( const mbedtls_ecp_group *grp, size_t *olen,
                         unsigned char *buf, size_t blen )
{
    const mbedtls_ecp_curve_info *curve_info;

    if( ( curve_info = mbedtls_ecp_curve_info_from_grp_id( grp->id ) ) == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * We are going to write 3 bytes (see below)
     */
    *olen = 3;
    if( blen < *olen )
        return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );

    /*
     * First byte is curve_type, always named_curve
     */
    *buf++ = MBEDTLS_ECP_TLS_NAMED_CURVE;

    /*
     * Next two bytes are the namedcurve value
     */
    buf[0] = curve_info->tls_id >> 8;
    buf[1] = curve_info->tls_id & 0xFF;

    return( 0 );
}